

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O0

int lj_cf_io_method_setvbuf(lua_State *L)

{
  int iVar1;
  int32_t iVar2;
  IOFileUD *pIVar3;
  char *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  size_t sz;
  int opt;
  FILE *fp;
  lua_State *in_stack_ffffffffffffffe0;
  int32_t in_stack_ffffffffffffffe8;
  FILE *__stream;
  int stat;
  
  pIVar3 = io_tofile(in_stack_ffffffffffffffe0);
  __stream = (FILE *)pIVar3->fp;
  iVar1 = lj_lib_checkopt((lua_State *)sz,unaff_retaddr_00,unaff_retaddr,in_RDI);
  stat = (int)((ulong)in_RDI >> 0x20);
  iVar2 = lj_lib_optint((lua_State *)__stream,iVar1,in_stack_ffffffffffffffe8);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else if (iVar1 == 1) {
    iVar1 = 1;
  }
  else if (iVar1 == 2) {
    iVar1 = 2;
  }
  setvbuf(__stream,(char *)0x0,iVar1,(long)iVar2);
  iVar1 = luaL_fileresult((lua_State *)CONCAT44(unaff_retaddr_00,unaff_retaddr),stat,
                          (char *)__stream);
  return iVar1;
}

Assistant:

LJLIB_CF(io_method_setvbuf)
{
  FILE *fp = io_tofile(L)->fp;
  int opt = lj_lib_checkopt(L, 2, -1, "\4full\4line\2no");
  size_t sz = (size_t)lj_lib_optint(L, 3, LUAL_BUFFERSIZE);
  if (opt == 0) opt = _IOFBF;
  else if (opt == 1) opt = _IOLBF;
  else if (opt == 2) opt = _IONBF;
  return luaL_fileresult(L, setvbuf(fp, NULL, opt, sz) == 0, NULL);
}